

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

string * cs::get_sdk_path_abi_cxx11_(void)

{
  __uid_t __uid;
  char *pcVar1;
  string *in_RDI;
  passwd *pw;
  char *sdk_path;
  char *in_stack_ffffffffffffff40;
  allocator *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_91;
  string local_90 [40];
  string *in_stack_ffffffffffffff98;
  allocator local_59;
  string local_58 [32];
  string local_38 [32];
  passwd *local_18;
  char *local_10;
  
  pcVar1 = getenv("COVSCRIPT_HOME");
  local_10 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    __uid = getuid();
    local_18 = getpwuid(__uid);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18->pw_dir;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,(char *)__lhs,&local_59);
    std::operator+(__lhs,in_stack_ffffffffffffff40);
    process_path(in_stack_ffffffffffffff98);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  else {
    paVar2 = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar1,paVar2);
    process_path(in_stack_ffffffffffffff98);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  return in_RDI;
}

Assistant:

std::string get_sdk_path()
	{
#ifdef COVSCRIPT_HOME
		return COVSCRIPT_HOME;
#else
		const char *sdk_path = std::getenv("COVSCRIPT_HOME");
		if (sdk_path == nullptr) {
			struct passwd *pw = getpwuid(getuid());
			return process_path(std::string(pw->pw_dir) + "/.covscript");
		}
		else
			return process_path(sdk_path);
#endif
	}